

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

void Js::JavascriptOperators::
     PatchPutValueWithThisPtrNoLocalFastPath<true,Js::PolymorphicInlineCache>
               (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId,Var newValue,
               Var thisInstance,PropertyOperationFlags flags)

{
  ImplicitCallFlags *pIVar1;
  byte bVar2;
  ImplicitCallFlags IVar3;
  undefined8 this;
  bool bVar4;
  BOOL BVar5;
  ScriptContext *requestContext;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  RecyclableObject *object;
  ScriptContext *pSVar6;
  ImplicitCallFlags IVar7;
  undefined1 local_a8 [8];
  PropertyValueInfo info;
  
  info._56_8_ = functionBody;
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  bVar4 = VarIs<Js::RecyclableObject>(instance);
  if (bVar4) {
    if (instance != (Var)0x0) {
      bVar4 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(instance);
      if (bVar4) {
        this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(instance);
        if (this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
          JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
        }
      }
    }
    object = UnsafeVarTo<Js::RecyclableObject>(instance);
    this = info._56_8_;
    local_a8 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_a8,(FunctionBody *)info._56_8_,inlineCache,
               inlineCacheIndex,false);
    bVar4 = CacheOperators::TrySetProperty<false,true,true,true,true,false,true,false>
                      (object,false,propertyId,newValue,requestContext,flags,
                       (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_a8);
    if (!bVar4) {
      bVar4 = Phases::IsEnabled((Phases *)&DAT_015b6718,InlineCachePhase);
      if ((bVar4) && (DAT_015bc46a == '\x01')) {
        CacheOperators::TraceCache
                  (inlineCache,L"PatchPutValueNoLocalFastPath",propertyId,requestContext,object);
      }
      bVar2 = *(byte *)(this + 0x48);
      IVar7 = ImplicitCall_None;
      if ((bVar2 & 0x20) != 0) {
        IVar7 = requestContext->threadContext->implicitCallFlags;
        ThreadContext::ClearImplicitCallFlags(requestContext->threadContext);
      }
      BVar5 = OP_SetProperty(instance,propertyId,newValue,requestContext,
                             (PropertyValueInfo *)local_a8,flags,thisInstance);
      if (BVar5 == 0) {
        pIVar1 = &requestContext->threadContext->implicitCallFlags;
        *pIVar1 = *pIVar1 | ImplicitCall_NoOpSet;
      }
      if ((bVar2 & 0x20) != 0) {
        pSVar6 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
        IVar3 = pSVar6->threadContext->implicitCallFlags;
        if (ImplicitCall_None < IVar3) {
          *(byte *)(this + 0x48) = *(byte *)(this + 0x48) & 0xdf;
        }
        requestContext->threadContext->implicitCallFlags = IVar3 | IVar7;
      }
    }
    return;
  }
  SetPropertyOnTaggedNumber
            (instance,(RecyclableObject *)0x0,propertyId,newValue,requestContext,flags);
  return;
}

Assistant:

inline void JavascriptOperators::PatchPutValueWithThisPtrNoLocalFastPath(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId, Var newValue, Var thisInstance, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchPutValueWithThisPtrNoLocalFastPath);
        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        if (TaggedNumber::Is(instance))
        {
            JavascriptOperators::SetPropertyOnTaggedNumber(instance,
                nullptr,
                propertyId,
                newValue,
                scriptContext,
                flags);
            return;
        }
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        RecyclableObject *object = UnsafeVarTo<RecyclableObject>(instance);

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        if (CacheOperators::TrySetProperty<!TInlineCache::IsPolymorphic, true, true, true, true, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false>(
            object, false, propertyId, newValue, scriptContext, flags, nullptr, &info))
        {
            return;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchPutValueNoLocalFastPath"), propertyId, scriptContext, object);
        }
#endif

        ImplicitCallFlags prevImplicitCallFlags = ImplicitCall_None;
        ImplicitCallFlags currImplicitCallFlags = ImplicitCall_None;
        bool hasThisOnlyStatements = functionBody->GetHasOnlyThisStmts();
        if (hasThisOnlyStatements)
        {
            prevImplicitCallFlags = CacheAndClearImplicitBit(scriptContext);
        }
        if (!JavascriptOperators::OP_SetProperty(instance, propertyId, newValue, scriptContext, &info, flags, thisInstance))
        {
            // Add implicit call flags, to bail out if field copy prop may propagate the wrong value.
            scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
        }
        if (hasThisOnlyStatements)
        {
            currImplicitCallFlags = CheckAndUpdateFunctionBodyWithImplicitFlag(functionBody);
            RestoreImplicitFlag(scriptContext, prevImplicitCallFlags, currImplicitCallFlags);
        }
        JIT_HELPER_END(Op_PatchPutValueWithThisPtrNoLocalFastPath);
    }